

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::
MatchExpr<std::vector<int,_std::allocator<int>_>,_Catch::Matchers::Vector::ContainsMatcher<int,_std::allocator<int>,_std::allocator<int>_>_>
::MatchExpr(MatchExpr<std::vector<int,_std::allocator<int>_>,_Catch::Matchers::Vector::ContainsMatcher<int,_std::allocator<int>,_std::allocator<int>_>_>
            *this,vector<int,_std::allocator<int>_> *arg,
           ContainsMatcher<int,_std::allocator<int>,_std::allocator<int>_> *matcher,
           StringRef *matcherString)

{
  int iVar1;
  StringRef *matcherString_local;
  ContainsMatcher<int,_std::allocator<int>,_std::allocator<int>_> *matcher_local;
  vector<int,_std::allocator<int>_> *arg_local;
  MatchExpr<std::vector<int,_std::allocator<int>_>,_Catch::Matchers::Vector::ContainsMatcher<int,_std::allocator<int>,_std::allocator<int>_>_>
  *this_local;
  
  iVar1 = (*(matcher->super_MatcherBase<std::vector<int,_std::allocator<int>_>_>).
            super_MatcherUntypedBase._vptr_MatcherUntypedBase[3])(matcher,arg);
  ITransientExpression::ITransientExpression(&this->super_ITransientExpression,true,SUB41(iVar1,0));
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00411eb8;
  this->m_arg = arg;
  Matchers::Vector::ContainsMatcher<int,_std::allocator<int>,_std::allocator<int>_>::ContainsMatcher
            (&this->m_matcher,matcher);
  (this->m_matcherString).m_start = matcherString->m_start;
  (this->m_matcherString).m_size = matcherString->m_size;
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
        :   ITransientExpression{ true, matcher.match( arg ) },
            m_arg( arg ),
            m_matcher( matcher ),
            m_matcherString( matcherString )
        {}